

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::ScriptSet::displayScripts(ScriptSet *this,UnicodeString *dest)

{
  bool bVar1;
  bool bVar2;
  char *src;
  undefined4 srcLength;
  int32_t scriptIndex;
  UScriptCode scriptCode;
  UnicodeString local_60;
  
  scriptCode = USCRIPT_COMMON;
  while ((this->bits[(uint)scriptCode >> 5] >> (scriptCode & USCRIPT_ORIYA) & 1) == 0) {
    scriptCode = scriptCode + USCRIPT_INHERITED;
    if (scriptCode == (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_BLISSYMBOLS)) {
      return dest;
    }
  }
  bVar2 = false;
  while( true ) {
    if (bVar2) {
      local_60.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x20;
      UnicodeString::doAppend(dest,(UChar *)&local_60,0,1);
    }
    src = uscript_getShortName_63(scriptCode);
    UnicodeString::UnicodeString(&local_60,src,-1,kInvariant);
    srcLength = local_60.fUnion.fFields.fLength;
    if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
      srcLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(dest,&local_60,0,srcLength);
    UnicodeString::~UnicodeString(&local_60);
    if (0xbe < (uint)scriptCode) break;
    scriptCode = scriptCode + USCRIPT_INHERITED;
    bVar2 = false;
    while (((bVar1 = bVar2, bVar2 || (bVar1 = true, 0xbf < (uint)scriptCode)) ||
           (bVar1 = bVar2,
           (this->bits[(uint)scriptCode >> 5] >> (scriptCode & USCRIPT_ORIYA) & 1) == 0))) {
      bVar2 = bVar1;
      scriptCode = scriptCode + USCRIPT_INHERITED;
      if (scriptCode == (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_BLISSYMBOLS)) {
        return dest;
      }
    }
    bVar2 = true;
  }
  return dest;
}

Assistant:

UnicodeString &ScriptSet::displayScripts(UnicodeString &dest) const {
    UBool firstTime = TRUE;
    for (int32_t i = nextSetBit(0); i >= 0; i = nextSetBit(i + 1)) {
        if (!firstTime) {
            dest.append((UChar)0x20);
        }
        firstTime = FALSE;
        const char *scriptName = uscript_getShortName((UScriptCode(i)));
        dest.append(UnicodeString(scriptName, -1, US_INV));
    }
    return dest;
}